

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.c
# Opt level: O3

xmlStreamCtxtPtr xmlPatternGetStreamCtxt(xmlPatternPtr comp)

{
  xmlStreamCompPtr pxVar1;
  _xmlStreamCtxt *p_Var2;
  _xmlStreamCtxt *p_Var3;
  _xmlStreamCtxt *p_Var4;
  
  if ((comp == (xmlPatternPtr)0x0) || (comp->stream == (xmlStreamCompPtr)0x0)) {
LAB_00171e8d:
    p_Var4 = (xmlStreamCtxtPtr)0x0;
  }
  else {
    p_Var4 = (xmlStreamCtxtPtr)0x0;
    do {
      pxVar1 = comp->stream;
      if ((pxVar1 == (xmlStreamCompPtr)0x0) ||
         (p_Var3 = (_xmlStreamCtxt *)(*xmlMalloc)(0x30), p_Var3 == (_xmlStreamCtxt *)0x0)) {
        if (p_Var4 != (xmlStreamCtxtPtr)0x0) {
          do {
            p_Var3 = p_Var4->next;
            if (p_Var4->states != (int *)0x0) {
              (*xmlFree)(p_Var4->states);
            }
            (*xmlFree)(p_Var4);
            p_Var4 = p_Var3;
          } while (p_Var3 != (_xmlStreamCtxt *)0x0);
          return (xmlStreamCtxtPtr)0x0;
        }
        goto LAB_00171e8d;
      }
      p_Var3->next = (_xmlStreamCtxt *)0x0;
      p_Var3->comp = (xmlStreamCompPtr)0x0;
      p_Var3->states = (int *)0x0;
      p_Var3->flags = 0;
      p_Var3->blockLevel = 0;
      p_Var3->nbState = 0;
      p_Var3->maxState = 0;
      *(undefined8 *)&p_Var3->level = 0;
      p_Var3->comp = pxVar1;
      p_Var3->blockLevel = -1;
      p_Var2 = p_Var3;
      if (p_Var4 != (xmlStreamCtxtPtr)0x0) {
        p_Var3->next = p_Var4->next;
        p_Var4->next = p_Var3;
        p_Var2 = p_Var4;
      }
      p_Var4 = p_Var2;
      p_Var3->flags = comp->flags;
      comp = comp->next;
    } while (comp != (_xmlPattern *)0x0);
  }
  return p_Var4;
}

Assistant:

xmlStreamCtxtPtr
xmlPatternGetStreamCtxt(xmlPatternPtr comp)
{
    xmlStreamCtxtPtr ret = NULL, cur;

    if ((comp == NULL) || (comp->stream == NULL))
        return(NULL);

    while (comp != NULL) {
        if (comp->stream == NULL)
	    goto failed;
	cur = xmlNewStreamCtxt(comp->stream);
	if (cur == NULL)
	    goto failed;
	if (ret == NULL)
	    ret = cur;
	else {
	    cur->next = ret->next;
	    ret->next = cur;
	}
	cur->flags = comp->flags;
	comp = comp->next;
    }
    return(ret);
failed:
    xmlFreeStreamCtxt(ret);
    return(NULL);
}